

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# losertree.h
# Opt level: O0

void __thiscall loser_tree<unsigned_char_*>::update(loser_tree<unsigned_char_*> *this)

{
  bool bVar1;
  int iVar2;
  Stream *pSVar3;
  uint local_18;
  uint local_14;
  uint i;
  uint new_min;
  loser_tree<unsigned_char_*> *this_local;
  
  local_14 = *this->_nodes;
  local_18 = this->_stream_offset + local_14;
  _i = this;
LAB_00275b27:
  local_18 = local_18 >> 1;
  if (local_18 == 0) {
    *this->_nodes = local_14;
    return;
  }
  bVar1 = stream_empty(this,this->_streams + local_14);
  if (!bVar1) goto code_r0x00275b4c;
  goto LAB_00275b9f;
code_r0x00275b4c:
  pSVar3 = node2stream(this,local_18);
  bVar1 = stream_empty(this,pSVar3);
  if (!bVar1) {
    pSVar3 = node2stream(this,local_18);
    iVar2 = cmp(*pSVar3->stream,*this->_streams[local_14].stream);
    if (iVar2 < 0) {
LAB_00275b9f:
      std::swap<unsigned_int>(&local_14,this->_nodes + local_18);
    }
  }
  goto LAB_00275b27;
}

Assistant:

void update()
	{
		//debug() << __PRETTY_FUNCTION__ << std::endl;
		unsigned new_min = _nodes[0];
		for (unsigned i=(_stream_offset+new_min) >> 1; i!=0; i >>= 1) {
			if (stream_empty(_streams[new_min]) or
			    (not stream_empty(node2stream(i)) and
			     cmp(*node2stream(i).stream,
			         *_streams[new_min].stream) < 0)) {
				std::swap(new_min, _nodes[i]);
			}
		}
		_nodes[0] = new_min;
	}